

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O2

string * __thiscall
vkt::ssbo::(anonymous_namespace)::genName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char first,char last,int ndx)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  int iVar4;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_29);
  iVar4 = (int)CONCAT71(in_register_00000011,first) - (int)this;
  iVar1 = iVar4 + 1;
  for (iVar3 = CONCAT31(in_register_00000009,last);
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p, iVar1 < iVar3;
      iVar3 = (iVar3 + -1) / iVar1) {
    std::__cxx11::string::insert
              (__return_storage_ptr__,pcVar2,(int)(char)((char)((iVar3 + -1) % iVar1) + (char)this))
    ;
  }
  std::__cxx11::string::insert
            (__return_storage_ptr__,pcVar2,
             (int)(char)((char)(iVar3 % (iVar4 + 2)) + (char)this + -1));
  return __return_storage_ptr__;
}

Assistant:

static std::string genName (char first, char last, int ndx)
{
	std::string	str			= "";
	int			alphabetLen	= last - first + 1;

	while (ndx > alphabetLen)
	{
		str.insert(str.begin(), (char)(first + ((ndx-1)%alphabetLen)));
		ndx = ((ndx-1) / alphabetLen);
	}

	str.insert(str.begin(), (char)(first + (ndx%(alphabetLen+1)) - 1));

	return str;
}